

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_CopyConstructorWithArenas_Test::
TestBody(GeneratedMessageTest_CopyConstructorWithArenas_Test *this)

{
  TestAllTypes *message;
  tuple<proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
  this_00;
  unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
  message2_heap;
  Arena arena;
  TestAllTypes message2_stack;
  __uniq_ptr_impl<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
  local_400;
  ThreadSafeArena local_3f8;
  TestAllTypes local_350;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_3f8);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_350);
  this_00.
  super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
  .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
        )operator_new(0x340);
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)
             this_00.
             super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
             .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl,message);
  local_400._M_t.
  super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
  .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl =
       (tuple<proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>)
       (tuple<proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>)
       this_00.
       super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
       .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl;
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)
             this_00.
             super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
             .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl);
  protobuf::internal::ThreadSafeArena::Reset(&local_3f8);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_350);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)
             local_400._M_t.
             super__Tuple_impl<0UL,_proto2_unittest::TestAllTypes_*,_std::default_delete<proto2_unittest::TestAllTypes>_>
             .super__Head_base<0UL,_proto2_unittest::TestAllTypes_*,_false>._M_head_impl);
  std::
  unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>::
  ~unique_ptr((unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
               *)&local_400);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_3f8);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, CopyConstructorWithArenas) {
  Arena arena;
  UNITTEST::TestAllTypes* message1 =
      Arena::Create<UNITTEST::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1);

  UNITTEST::TestAllTypes message2_stack(*message1);
  TestUtil::ExpectAllFieldsSet(message2_stack);

  std::unique_ptr<UNITTEST::TestAllTypes> message2_heap(
      new UNITTEST::TestAllTypes(*message1));
  TestUtil::ExpectAllFieldsSet(*message2_heap);

  arena.Reset();

  // Verify that the copies are still intact.
  TestUtil::ExpectAllFieldsSet(message2_stack);
  TestUtil::ExpectAllFieldsSet(*message2_heap);
}